

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

char * zlib_rc(zlib *zlib)

{
  zlib *zlib_local;
  
  switch(zlib->rc) {
  case 0:
    zlib_local = (zlib *)anon_var_dwarf_1185;
    break;
  case 1:
    zlib_local = (zlib *)anon_var_dwarf_1191;
    break;
  case 2:
    zlib_local = (zlib *)anon_var_dwarf_119d;
    break;
  case -6:
    zlib_local = (zlib *)anon_var_dwarf_11e5;
    break;
  case -5:
    zlib_local = (zlib *)anon_var_dwarf_11d9;
    break;
  case -4:
    zlib_local = (zlib *)anon_var_dwarf_11cd;
    break;
  case -3:
    zlib_local = (zlib *)anon_var_dwarf_11c1;
    break;
  case -2:
    zlib_local = (zlib *)anon_var_dwarf_11b5;
    break;
  case -1:
    zlib_local = (zlib *)anon_var_dwarf_11a9;
    break;
  default:
    zlib_local = (zlib *)anon_var_dwarf_11f1;
  }
  return (char *)zlib_local;
}

Assistant:

static const char *
zlib_rc(struct zlib *zlib)
   /* Return a string for the zlib return code */
{
   switch (zlib->rc)
   {
      case Z_OK:              return "Z_OK";
      case Z_STREAM_END:      return "Z_STREAM_END";
      case Z_NEED_DICT:       return "Z_NEED_DICT";
      case Z_ERRNO:           return "Z_ERRNO";
      case Z_STREAM_ERROR:    return "Z_STREAM_ERROR";
      case Z_DATA_ERROR:      return "Z_DATA_ERROR";
      case Z_MEM_ERROR:       return "Z_MEM_ERROR";
      case Z_BUF_ERROR:       return "Z_BUF_ERROR";
      case Z_VERSION_ERROR:   return "Z_VERSION_ERROR";
      default:                return "Z_*INVALID_RC*";
   }
}